

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void example2(string *fileNameIn,string *fileNameOut)

{
  pointer pgVar1;
  size_t __n;
  void *__buf;
  allocator<char> local_1e9;
  vector<gdsSTR,_std::allocator<gdsSTR>_> arrSTR;
  string local_1c8;
  vector<int,_std::allocator<int>_> corY;
  vector<int,_std::allocator<int>_> corX;
  vector<gdsSTR,_std::allocator<gdsSTR>_> local_168;
  gdsSREF local_150;
  gdscpp fooGDS;
  
  gdscpp::gdscpp(&fooGDS);
  arrSTR.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  arrSTR.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  arrSTR.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::resize(&arrSTR,1);
  corX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  corX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  corX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  corY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  corY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  corY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::__cxx11::string::assign
            ((char *)(arrSTR.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                      super__Vector_impl_data._M_finish + -1));
  pgVar1 = arrSTR.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"arrow_box",&local_1e9);
  drawSREF(&local_150,&local_1c8,0,0);
  std::vector<gdsSREF,_std::allocator<gdsSREF>_>::emplace_back<gdsSREF>(&pgVar1[-1].SREF,&local_150)
  ;
  gdsSREF::~gdsSREF(&local_150);
  std::__cxx11::string::~string((string *)&local_1c8);
  pgVar1 = arrSTR.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"arrow_box",&local_1e9);
  __n = 500;
  drawSREF(&local_150,&local_1c8,500,500,0.0,1.0,false);
  std::vector<gdsSREF,_std::allocator<gdsSREF>_>::emplace_back<gdsSREF>(&pgVar1[-1].SREF,&local_150)
  ;
  gdsSREF::~gdsSREF(&local_150);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&fooGDS.GDSfileName,fileNameIn);
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::vector(&local_168,&arrSTR);
  gdscpp::setSTR(&fooGDS,&local_168);
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::~vector(&local_168);
  gdscpp::write(&fooGDS,(int)fileNameOut,__buf,__n);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&corY.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&corX.super__Vector_base<int,_std::allocator<int>_>);
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::~vector(&arrSTR);
  gdscpp::~gdscpp(&fooGDS);
  return;
}

Assistant:

void example2(const string &fileNameIn, const string &fileNameOut)
{
  gdscpp fooGDS;
  vector<gdsSTR> arrSTR;
  arrSTR.resize(arrSTR.size() + 1);

  vector<int> corX;
  vector<int> corY;

  arrSTR.back().name = "example2";
  arrSTR.back().SREF.push_back(drawSREF("arrow_box", 0, 0));
  arrSTR.back().SREF.push_back(drawSREF("arrow_box", 500, 500, 0, 1, false));

  fooGDS.importGDSfile(fileNameIn);
  fooGDS.setSTR(arrSTR);
  fooGDS.write(fileNameOut);
}